

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O2

void av1_rc_update_framerate(AV1_COMP *cpi,int width,int height)

{
  double framerate;
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  double dVar11;
  double dVar12;
  
  iVar3 = av1_get_MBs(width,height);
  framerate = cpi->framerate;
  dVar11 = round((double)(cpi->oxcf).rc_cfg.target_bandwidth / framerate);
  dVar12 = 2147483647.0;
  if (dVar11 <= 2147483647.0) {
    dVar12 = dVar11;
  }
  iVar4 = (int)dVar12;
  (cpi->rc).avg_frame_bandwidth = iVar4;
  lVar6 = ((long)(cpi->oxcf).rc_cfg.vbrmin_section * (long)iVar4) / 100;
  if (0x7ffffffe < lVar6) {
    lVar6 = 0x7fffffff;
  }
  iVar9 = 200;
  if (200 < (int)lVar6) {
    iVar9 = (int)lVar6;
  }
  (cpi->rc).min_frame_bandwidth = iVar9;
  lVar7 = ((long)(cpi->oxcf).rc_cfg.vbrmax_section * (long)iVar4) / 100;
  lVar6 = 0x7fffffff;
  if (lVar7 < 0x7fffffff) {
    lVar6 = lVar7;
  }
  iVar4 = (int)lVar6;
  if ((int)lVar6 < iVar3 * 0xfa) {
    iVar4 = iVar3 * 0xfa;
  }
  iVar3 = 0x1ee628;
  if (0x1ee628 < iVar4) {
    iVar3 = iVar4;
  }
  (cpi->rc).max_frame_bandwidth = iVar3;
  if ((((cpi->oxcf).pass == AOM_RC_ONE_PASS) && (cpi->ppi->lap_enabled == 0)) &&
     ((cpi->oxcf).rc_cfg.mode == AOM_Q)) {
    uVar1 = (cpi->oxcf).gf_cfg.min_gf_interval;
    uVar2 = (cpi->oxcf).gf_cfg.max_gf_interval;
    (cpi->rc).min_gf_interval = uVar1;
    (cpi->rc).max_gf_interval = uVar2;
    (cpi->rc).static_scene_max_gf_interval = uVar1 + 1;
  }
  else {
    uVar5 = (cpi->oxcf).gf_cfg.min_gf_interval;
    uVar10 = (cpi->oxcf).gf_cfg.max_gf_interval;
    (cpi->rc).max_gf_interval = uVar10;
    if (uVar5 == 0) {
      uVar5 = av1_rc_get_default_min_gf_interval
                        ((cpi->oxcf).frm_dim_cfg.width,(cpi->oxcf).frm_dim_cfg.height,framerate);
    }
    if (uVar10 == 0) {
      uVar10 = (int)(framerate * 0.75);
      if (0x1f < (int)(framerate * 0.75)) {
        uVar10 = 0x20;
      }
      uVar10 = (uVar10 & 1) + uVar10;
      if ((int)uVar10 <= (int)uVar5) {
        uVar10 = uVar5;
      }
      if ((int)uVar10 < 0x21) {
        uVar10 = 0x20;
      }
      (cpi->rc).max_gf_interval = uVar10;
    }
    uVar8 = 0xfa;
    if (cpi->ppi->lap_enabled != 0) {
      uVar8 = uVar10 + 1;
    }
    (cpi->rc).static_scene_max_gf_interval = uVar8;
    if ((int)uVar8 < (int)uVar10) {
      (cpi->rc).max_gf_interval = uVar8;
      uVar10 = uVar8;
    }
    if ((int)uVar5 < (int)uVar10) {
      uVar10 = uVar5;
    }
    (cpi->rc).min_gf_interval = uVar10;
  }
  return;
}

Assistant:

void av1_rc_update_framerate(AV1_COMP *cpi, int width, int height) {
  const AV1EncoderConfig *const oxcf = &cpi->oxcf;
  RATE_CONTROL *const rc = &cpi->rc;
  const int MBs = av1_get_MBs(width, height);

  rc->avg_frame_bandwidth = saturate_cast_double_to_int(
      round(oxcf->rc_cfg.target_bandwidth / cpi->framerate));

  int64_t vbr_min_bits =
      (int64_t)rc->avg_frame_bandwidth * oxcf->rc_cfg.vbrmin_section / 100;
  vbr_min_bits = AOMMIN(vbr_min_bits, INT_MAX);

  rc->min_frame_bandwidth = AOMMAX((int)vbr_min_bits, FRAME_OVERHEAD_BITS);

  // A maximum bitrate for a frame is defined.
  // The baseline for this aligns with HW implementations that
  // can support decode of 1080P content up to a bitrate of MAX_MB_RATE bits
  // per 16x16 MB (averaged over a frame). However this limit is extended if
  // a very high rate is given on the command line or the rate cannot
  // be achieved because of a user specified max q (e.g. when the user
  // specifies lossless encode.
  int64_t vbr_max_bits =
      (int64_t)rc->avg_frame_bandwidth * oxcf->rc_cfg.vbrmax_section / 100;
  vbr_max_bits = AOMMIN(vbr_max_bits, INT_MAX);

  rc->max_frame_bandwidth =
      AOMMAX(AOMMAX((MBs * MAX_MB_RATE), MAXRATE_1080P), (int)vbr_max_bits);

  set_gf_interval_range(cpi, rc);
}